

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O2

int FindHostApi(PaDeviceIndex device,int *hostSpecificDeviceIndex)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  if ((-1 < device) && (initializationCount_ != 0)) {
    uVar2 = 0;
    uVar3 = (ulong)(uint)hostApisCount_;
    if (hostApisCount_ < 1) {
      uVar3 = uVar2;
    }
    for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
      iVar1 = (hostApis_[uVar2]->info).deviceCount;
      if (device < iVar1) {
        if (hostSpecificDeviceIndex != (int *)0x0) {
          *hostSpecificDeviceIndex = device;
        }
        return (int)uVar2;
      }
      device = device - iVar1;
    }
  }
  return -1;
}

Assistant:

static int FindHostApi( PaDeviceIndex device, int *hostSpecificDeviceIndex )
{
    int i=0;

    if( !PA_IS_INITIALISED_ )
        return -1;

    if( device < 0 )
        return -1;

    while( i < hostApisCount_
            && device >= hostApis_[i]->info.deviceCount )
    {

        device -= hostApis_[i]->info.deviceCount;
        ++i;
    }

    if( i >= hostApisCount_ )
        return -1;

    if( hostSpecificDeviceIndex )
        *hostSpecificDeviceIndex = device;

    return i;
}